

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

MarketDataRequest * __thiscall
Application::queryMarketDataRequest50(MarketDataRequest *__return_storage_ptr__,Application *this)

{
  Header *header;
  ostream *poVar1;
  string local_360 [32];
  string local_340 [38];
  undefined1 local_31a;
  allocator<char> local_319;
  STRING local_318;
  undefined1 local_2f8 [8];
  Symbol symbol;
  NoRelatedSym symbolGroup;
  MDEntryType mdEntryType;
  NoMDEntryTypes marketDataEntryGroup;
  MarketDepth marketDepth;
  SubscriptionRequestType subType;
  allocator<char> local_91;
  STRING local_90;
  undefined1 local_70 [8];
  MDReqID mdReqID;
  Application *this_local;
  MarketDataRequest *message;
  
  mdReqID.super_StringField.super_FieldBase.m_metrics = (field_metrics)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"MARKETDATAID",&local_91);
  FIX::MDReqID::MDReqID((MDReqID *)local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  FIX::SubscriptionRequestType::SubscriptionRequestType
            ((SubscriptionRequestType *)&marketDepth.super_IntField.super_FieldBase.m_metrics,
             "0012568912340321511Application");
  FIX::MarketDepth::MarketDepth((MarketDepth *)&marketDataEntryGroup.super_Group.m_field,0);
  FIX50::MarketDataRequest::NoMDEntryTypes::NoMDEntryTypes
            ((NoMDEntryTypes *)&mdEntryType.super_CharField.super_FieldBase.m_metrics);
  FIX::MDEntryType::MDEntryType
            ((MDEntryType *)&symbolGroup.super_Group.m_field,"012568912340321511Application");
  FIX50::MarketDataRequest::NoMDEntryTypes::set
            ((NoMDEntryTypes *)&mdEntryType.super_CharField.super_FieldBase.m_metrics,
             (MDEntryType *)&symbolGroup.super_Group.m_field);
  FIX50::MarketDataRequest::NoRelatedSym::NoRelatedSym
            ((NoRelatedSym *)&symbol.super_StringField.super_FieldBase.m_metrics);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"LNUX",&local_319);
  FIX::Symbol::Symbol((Symbol *)local_2f8,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  FIX50::MarketDataRequest::NoRelatedSym::set
            ((NoRelatedSym *)&symbol.super_StringField.super_FieldBase.m_metrics,(Symbol *)local_2f8
            );
  local_31a = 0;
  FIX50::MarketDataRequest::MarketDataRequest
            (__return_storage_ptr__,(MDReqID *)local_70,
             (SubscriptionRequestType *)&marketDepth.super_IntField.super_FieldBase.m_metrics,
             (MarketDepth *)&marketDataEntryGroup.super_Group.m_field);
  FIX::Message::addGroup
            ((Message *)__return_storage_ptr__,
             (Group *)&mdEntryType.super_CharField.super_FieldBase.m_metrics);
  FIX::Message::addGroup
            ((Message *)__return_storage_ptr__,
             (Group *)&symbol.super_StringField.super_FieldBase.m_metrics);
  header = FIX50::Message::getHeader(&__return_storage_ptr__->super_Message);
  queryHeader(this,(Header *)header);
  FIX::Message::toXML_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,local_340);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_340);
  FIX::Message::toString_abi_cxx11_((int)local_360,(int)__return_storage_ptr__,8);
  poVar1 = std::operator<<((ostream *)&std::cout,local_360);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_360);
  local_31a = 1;
  FIX::Symbol::~Symbol((Symbol *)local_2f8);
  FIX50::MarketDataRequest::NoRelatedSym::~NoRelatedSym
            ((NoRelatedSym *)&symbol.super_StringField.super_FieldBase.m_metrics);
  FIX::MDEntryType::~MDEntryType((MDEntryType *)&symbolGroup.super_Group.m_field);
  FIX50::MarketDataRequest::NoMDEntryTypes::~NoMDEntryTypes
            ((NoMDEntryTypes *)&mdEntryType.super_CharField.super_FieldBase.m_metrics);
  FIX::MarketDepth::~MarketDepth((MarketDepth *)&marketDataEntryGroup.super_Group.m_field);
  FIX::SubscriptionRequestType::~SubscriptionRequestType
            ((SubscriptionRequestType *)&marketDepth.super_IntField.super_FieldBase.m_metrics);
  FIX::MDReqID::~MDReqID((MDReqID *)local_70);
  return __return_storage_ptr__;
}

Assistant:

FIX50::MarketDataRequest Application::queryMarketDataRequest50() {
  FIX::MDReqID mdReqID("MARKETDATAID");
  FIX::SubscriptionRequestType subType(FIX::SubscriptionRequestType_SNAPSHOT);
  FIX::MarketDepth marketDepth(0);

  FIX50::MarketDataRequest::NoMDEntryTypes marketDataEntryGroup;
  FIX::MDEntryType mdEntryType(FIX::MDEntryType_BID);
  marketDataEntryGroup.set(mdEntryType);

  FIX50::MarketDataRequest::NoRelatedSym symbolGroup;
  FIX::Symbol symbol("LNUX");
  symbolGroup.set(symbol);

  FIX50::MarketDataRequest message(mdReqID, subType, marketDepth);
  message.addGroup(marketDataEntryGroup);
  message.addGroup(symbolGroup);

  queryHeader(message.getHeader());

  std::cout << message.toXML() << std::endl;
  std::cout << message.toString() << std::endl;

  return message;
}